

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3detectionoutput.cpp
# Opt level: O0

int __thiscall ncnn::Yolov3DetectionOutput::load_param(Yolov3DetectionOutput *this,ParamDict *pd)

{
  int iVar1;
  Mat *in_RSI;
  Mat *in_RDI;
  float fVar2;
  Mat *in_stack_fffffffffffffe30;
  Mat *pMVar3;
  Mat *in_stack_fffffffffffffe38;
  Mat *this_00;
  Mat local_1a0 [2];
  Mat local_120 [2];
  Mat local_90 [2];
  Mat *local_10;
  
  local_10 = in_RSI;
  iVar1 = ParamDict::get((ParamDict *)in_RSI,0,0x14);
  *(int *)&in_RDI[2].cstep = iVar1;
  iVar1 = ParamDict::get((ParamDict *)local_10,1,5);
  *(int *)((long)&in_RDI[2].cstep + 4) = iVar1;
  fVar2 = ParamDict::get((ParamDict *)local_10,2,0.01);
  *(float *)&in_RDI[3].data = fVar2;
  fVar2 = ParamDict::get((ParamDict *)local_10,3,0.45);
  *(float *)((long)&in_RDI[3].data + 4) = fVar2;
  this_00 = local_90;
  pMVar3 = local_10;
  Mat::Mat(this_00);
  iVar1 = (int)((ulong)pMVar3 >> 0x20);
  ParamDict::get((ParamDict *)this_00,iVar1,in_RDI);
  Mat::operator=(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
  Mat::~Mat((Mat *)0x1aea4c);
  Mat::~Mat((Mat *)0x1aea59);
  Mat::Mat(local_120);
  ParamDict::get((ParamDict *)this_00,iVar1,in_RDI);
  Mat::operator=(local_10,in_stack_fffffffffffffe30);
  Mat::~Mat((Mat *)0x1aeabe);
  Mat::~Mat((Mat *)0x1aeacb);
  pMVar3 = local_1a0;
  Mat::Mat(pMVar3);
  ParamDict::get((ParamDict *)this_00,iVar1,in_RDI);
  Mat::operator=(local_10,pMVar3);
  Mat::~Mat((Mat *)0x1aeb22);
  Mat::~Mat((Mat *)0x1aeb2c);
  return 0;
}

Assistant:

int Yolov3DetectionOutput::load_param(const ParamDict& pd)
{
    num_class = pd.get(0, 20);
    num_box = pd.get(1, 5);
    confidence_threshold = pd.get(2, 0.01f);
    nms_threshold = pd.get(3, 0.45f);
    biases = pd.get(4, Mat());
    mask = pd.get(5, Mat());
    anchors_scale = pd.get(6, Mat());
    return 0;
}